

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::OperatorMultiplyFun::GetFunctions(void)

{
  PhysicalType PVar1;
  pointer pSVar2;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  LogicalType varargs_03;
  bool bVar3;
  NotImplementedException *this;
  PhysicalType type;
  ScalarFunction *func;
  pointer function_00;
  ScalarFunctionSet *in_RDI;
  long lVar4;
  pointer other;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  undefined4 in_stack_fffffffffffff554;
  undefined4 in_stack_fffffffffffff55c;
  FunctionNullHandling in_stack_fffffffffffff568;
  ScalarFunctionSet *bind_lambda;
  allocator_type local_a82;
  allocator local_a81;
  vector<duckdb::ScalarFunction,_true> *local_a80;
  undefined1 local_a78 [48];
  _Any_data local_a48;
  undefined8 local_a38;
  undefined8 uStack_a30;
  LogicalType *local_a20;
  scalar_function_t local_a18;
  scalar_function_t local_9f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_9d8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_9c0;
  LogicalType local_9a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_990;
  LogicalType local_978;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_960;
  LogicalType local_948;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_930;
  LogicalType local_918;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_900;
  _Any_data local_8e8;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  LogicalType local_8c0;
  LogicalType local_8a8;
  LogicalType local_890;
  scalar_function_t local_878;
  LogicalType local_858;
  LogicalType local_840;
  LogicalType local_828;
  string local_810;
  string local_7f0;
  ScalarFunction function;
  ScalarFunction local_6a8;
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ::std::__cxx11::string::string
            ((string *)&local_810,anon_var_dwarf_3b2a95a + 8,(allocator *)&function);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_810);
  ::std::__cxx11::string::~string((string *)&local_810);
  LogicalType::Numeric();
  local_a20 = local_9c0.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_a80 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  other = local_9c0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          _M_impl.super__Vector_impl_data._M_start;
  do {
    if (other == local_a20) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_9c0);
      LogicalType::LogicalType((LogicalType *)&function,INTERVAL);
      bind_lambda = in_RDI;
      LogicalType::LogicalType
                ((LogicalType *)
                 &function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.field_2
                 ,DOUBLE);
      __l_02._M_len = 2;
      __l_02._M_array = (iterator)&function;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_960,__l_02,(allocator_type *)local_a78);
      LogicalType::LogicalType(&local_978,INTERVAL);
      local_9f8.super__Function_base._M_functor._8_8_ = 0;
      local_9f8.super__Function_base._M_functor._M_unused._M_function_pointer =
           ScalarFunction::
           BinaryFunction<duckdb::interval_t,double,duckdb::interval_t,duckdb::MultiplyOperator>;
      local_9f8._M_invoker =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_invoke;
      local_9f8.super__Function_base._M_manager =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_manager;
      LogicalType::LogicalType(&local_8a8,INVALID);
      varargs_02.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_02._0_8_ = &local_8a8;
      varargs_02.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffff554;
      varargs_02.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_02.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffff55c;
      ScalarFunction::ScalarFunction
                (&local_580,(vector<duckdb::LogicalType,_true> *)&local_960,&local_978,&local_9f8,
                 (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                 (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_02,CONSISTENT,
                 in_stack_fffffffffffff568,(bind_lambda_function_t)bind_lambda);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&local_a80->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_580);
      ScalarFunction::~ScalarFunction(&local_580);
      LogicalType::~LogicalType(&local_8a8);
      ::std::_Function_base::~_Function_base(&local_9f8.super__Function_base);
      LogicalType::~LogicalType(&local_978);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_960);
      lVar4 = 0x18;
      do {
        LogicalType::~LogicalType
                  ((LogicalType *)
                   ((long)&function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                           _vptr_Function + lVar4));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
      LogicalType::LogicalType((LogicalType *)&function,BIGINT);
      LogicalType::LogicalType
                ((LogicalType *)
                 &function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.field_2
                 ,INTERVAL);
      __l_03._M_len = 2;
      __l_03._M_array = (iterator)&function;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_990,__l_03,(allocator_type *)local_a78);
      LogicalType::LogicalType(&local_9a8,INTERVAL);
      local_a18.super__Function_base._M_functor._8_8_ = 0;
      local_a18.super__Function_base._M_functor._M_unused._M_function_pointer =
           ScalarFunction::
           BinaryFunction<long,duckdb::interval_t,duckdb::interval_t,duckdb::MultiplyOperator>;
      local_a18._M_invoker =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_invoke;
      local_a18.super__Function_base._M_manager =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_manager;
      LogicalType::LogicalType(&local_8c0,INVALID);
      varargs_03.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_03._0_8_ = &local_8c0;
      varargs_03.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffff554;
      varargs_03.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_03.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffff55c;
      ScalarFunction::ScalarFunction
                (&local_6a8,(vector<duckdb::LogicalType,_true> *)&local_990,&local_9a8,&local_a18,
                 (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                 (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_03,CONSISTENT,
                 in_stack_fffffffffffff568,(bind_lambda_function_t)bind_lambda);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&local_a80->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_6a8);
      ScalarFunction::~ScalarFunction(&local_6a8);
      LogicalType::~LogicalType(&local_8c0);
      ::std::_Function_base::~_Function_base(&local_a18.super__Function_base);
      LogicalType::~LogicalType(&local_9a8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_990);
      lVar4 = 0x18;
      do {
        LogicalType::~LogicalType
                  ((LogicalType *)
                   ((long)&function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                           _vptr_Function + lVar4));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
      pSVar2 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
               super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
               super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (function_00 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
                         super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                         .
                         super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start; function_00 != pSVar2;
          function_00 = function_00 + 1) {
        BaseScalarFunction::SetReturnsError(&local_e0,&function_00->super_BaseScalarFunction);
        BaseScalarFunction::~BaseScalarFunction(&local_e0);
      }
      return in_RDI;
    }
    if (other->id_ == DECIMAL) {
      LogicalType::LogicalType((LogicalType *)local_a78,other);
      LogicalType::LogicalType((LogicalType *)(local_a78 + 0x18),other);
      __l._M_len = 2;
      __l._M_array = (iterator)local_a78;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_9d8,__l,(allocator_type *)&local_7f0);
      LogicalType::LogicalType(&local_828,other);
      local_8d8 = 0;
      uStack_8d0 = 0;
      local_8e8._M_unused._M_object = (void *)0x0;
      local_8e8._8_8_ = 0;
      LogicalType::LogicalType(&local_840,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_840;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffff554;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffff55c;
      ScalarFunction::ScalarFunction
                (&function,(vector<duckdb::LogicalType,_true> *)&local_9d8,&local_828,
                 (scalar_function_t *)&local_8e8,BindDecimalMultiply,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffff568,
                 (bind_lambda_function_t)in_RDI);
      LogicalType::~LogicalType(&local_840);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_8e8);
      LogicalType::~LogicalType(&local_828);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_9d8);
      lVar4 = 0x18;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_a78 + lVar4));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
      function.serialize = SerializeDecimalArithmetic;
      function.deserialize =
           DeserializeDecimalArithmetic<duckdb::MultiplyOperator,duckdb::DecimalMultiplyOverflowCheck,false>
      ;
      ScalarFunction::ScalarFunction(&local_208,&function);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&local_a80->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 &local_208);
      ScalarFunction::~ScalarFunction(&local_208);
      ScalarFunction::~ScalarFunction(&function);
    }
    else {
      bVar3 = TypeIsIntegral(other->physical_type_);
      if (bVar3) {
        LogicalType::LogicalType((LogicalType *)&function,other);
        LogicalType::LogicalType
                  ((LogicalType *)
                   &function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
                    field_2,other);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)&function;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_900,__l_00,&local_a82);
        LogicalType::LogicalType(&local_918,other);
        PVar1 = other->physical_type_;
        local_a48._M_unused._M_object = (void *)0x0;
        local_a48._8_8_ = 0;
        local_a38 = 0;
        uStack_a30 = 0;
        switch(PVar1) {
        case UINT8:
          local_a78._0_8_ =
               ScalarFunction::
               BinaryFunction<unsigned_char,unsigned_char,unsigned_char,duckdb::MultiplyOperatorOverflowCheck>
          ;
          break;
        case INT8:
          local_a78._0_8_ =
               ScalarFunction::
               BinaryFunction<signed_char,signed_char,signed_char,duckdb::MultiplyOperatorOverflowCheck>
          ;
          break;
        case UINT16:
          local_a78._0_8_ =
               ScalarFunction::
               BinaryFunction<unsigned_short,unsigned_short,unsigned_short,duckdb::MultiplyOperatorOverflowCheck>
          ;
          break;
        case INT16:
          local_a78._0_8_ =
               ScalarFunction::
               BinaryFunction<short,short,short,duckdb::MultiplyOperatorOverflowCheck>;
          break;
        case UINT32:
          local_a78._0_8_ =
               ScalarFunction::
               BinaryFunction<unsigned_int,unsigned_int,unsigned_int,duckdb::MultiplyOperatorOverflowCheck>
          ;
          break;
        case INT32:
          local_a78._0_8_ =
               ScalarFunction::BinaryFunction<int,int,int,duckdb::MultiplyOperatorOverflowCheck>;
          break;
        case UINT64:
          local_a78._0_8_ =
               ScalarFunction::
               BinaryFunction<unsigned_long,unsigned_long,unsigned_long,duckdb::MultiplyOperatorOverflowCheck>
          ;
          break;
        case INT64:
          local_a78._0_8_ =
               ScalarFunction::BinaryFunction<long,long,long,duckdb::MultiplyOperatorOverflowCheck>;
          break;
        default:
          if (PVar1 == UINT128) {
            local_a78._0_8_ =
                 ScalarFunction::
                 BinaryFunction<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::MultiplyOperatorOverflowCheck>
            ;
          }
          else {
            if (PVar1 != INT128) {
              this = (NotImplementedException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)local_a78,"Unimplemented type for GetScalarBinaryFunction: %s",
                         &local_a81);
              TypeIdToString_abi_cxx11_(&local_7f0,(duckdb *)(ulong)PVar1,type);
              NotImplementedException::NotImplementedException<std::__cxx11::string>
                        (this,(string *)local_a78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_7f0);
              __cxa_throw(this,&NotImplementedException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            local_a78._0_8_ =
                 ScalarFunction::
                 BinaryFunction<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::MultiplyOperatorOverflowCheck>
            ;
          }
        }
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  local_a48._M_pod_data,
                  (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)local_a78);
        LogicalType::LogicalType(&local_858,INVALID);
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_01._0_8_ = &local_858;
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffff554;
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_01.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffff55c;
        ScalarFunction::ScalarFunction
                  (&local_330,(vector<duckdb::LogicalType,_true> *)&local_900,&local_918,
                   (scalar_function_t *)&local_a48,(bind_scalar_function_t)0x0,
                   (bind_scalar_function_extended_t)0x0,
                   PropagateNumericStats<duckdb::TryMultiplyOperator,duckdb::MultiplyPropagateStatistics,duckdb::MultiplyOperator>
                   ,(init_local_state_t)0x0,varargs_01,CONSISTENT,in_stack_fffffffffffff568,
                   (bind_lambda_function_t)in_RDI);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_a80->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_330);
        ScalarFunction::~ScalarFunction(&local_330);
        LogicalType::~LogicalType(&local_858);
        ::std::_Function_base::~_Function_base((_Function_base *)&local_a48);
        LogicalType::~LogicalType(&local_918);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_900);
        lVar4 = 0x18;
        do {
          LogicalType::~LogicalType
                    ((LogicalType *)
                     ((long)&function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                             _vptr_Function + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
      }
      else {
        LogicalType::LogicalType((LogicalType *)&function,other);
        LogicalType::LogicalType
                  ((LogicalType *)
                   &function.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
                    field_2,other);
        __l_01._M_len = 2;
        __l_01._M_array = (iterator)&function;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_930,__l_01,(allocator_type *)local_a78);
        LogicalType::LogicalType(&local_948,other);
        GetScalarBinaryFunction<duckdb::MultiplyOperator>(&local_878,other->physical_type_);
        LogicalType::LogicalType(&local_890,INVALID);
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_00._0_8_ = &local_890;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffff554;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffff55c;
        ScalarFunction::ScalarFunction
                  (&local_458,(vector<duckdb::LogicalType,_true> *)&local_930,&local_948,&local_878,
                   (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
                   (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
                   in_stack_fffffffffffff568,(bind_lambda_function_t)in_RDI);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&local_a80->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_458);
        ScalarFunction::~ScalarFunction(&local_458);
        LogicalType::~LogicalType(&local_890);
        ::std::_Function_base::~_Function_base(&local_878.super__Function_base);
        LogicalType::~LogicalType(&local_948);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  (&local_930);
        lVar4 = 0x18;
        do {
          LogicalType::~LogicalType
                    ((LogicalType *)
                     ((long)&function.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                             _vptr_Function + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
      }
    }
    other = other + 1;
  } while( true );
}

Assistant:

ScalarFunctionSet OperatorMultiplyFun::GetFunctions() {
	ScalarFunctionSet multiply("*");
	for (auto &type : LogicalType::Numeric()) {
		if (type.id() == LogicalTypeId::DECIMAL) {
			ScalarFunction function({type, type}, type, nullptr, BindDecimalMultiply);
			function.serialize = SerializeDecimalArithmetic;
			function.deserialize = DeserializeDecimalArithmetic<MultiplyOperator, DecimalMultiplyOverflowCheck>;
			multiply.AddFunction(function);
		} else if (TypeIsIntegral(type.InternalType())) {
			multiply.AddFunction(ScalarFunction(
			    {type, type}, type, GetScalarIntegerFunction<MultiplyOperatorOverflowCheck>(type.InternalType()),
			    nullptr, nullptr,
			    PropagateNumericStats<TryMultiplyOperator, MultiplyPropagateStatistics, MultiplyOperator>));
		} else {
			multiply.AddFunction(
			    ScalarFunction({type, type}, type, GetScalarBinaryFunction<MultiplyOperator>(type.InternalType())));
		}
	}
	multiply.AddFunction(
	    ScalarFunction({LogicalType::INTERVAL, LogicalType::DOUBLE}, LogicalType::INTERVAL,
	                   ScalarFunction::BinaryFunction<interval_t, double, interval_t, MultiplyOperator>));
	multiply.AddFunction(
	    ScalarFunction({LogicalType::BIGINT, LogicalType::INTERVAL}, LogicalType::INTERVAL,
	                   ScalarFunction::BinaryFunction<int64_t, interval_t, interval_t, MultiplyOperator>));
	for (auto &func : multiply.functions) {
		ScalarFunction::SetReturnsError(func);
	}

	return multiply;
}